

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar7;
  ulong uVar4;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 *puVar12;
  int *piVar13;
  bool bVar14;
  void *pvVar15;
  char cVar16;
  int iVar17;
  float *pfVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  pointer pOVar25;
  uint uVar26;
  int left;
  int w;
  int top;
  undefined1 auVar27 [16];
  int iVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vector<Object,_std::allocator<Object>_> objects8;
  vector<Object,_std::allocator<Object>_> proposals;
  int baseLine;
  Extractor ex;
  Mat anchors;
  vector<Object,_std::allocator<Object>_> objects;
  Mat in_pad;
  Mat out;
  float norm_vals [3];
  Mat in;
  Net yolov5;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar9 = argv[1];
    std::__cxx11::string::string((string *)&yolov5,pcVar9,(allocator *)&in);
    cv::imread((string *)&m,(int)&yolov5);
    if ((Allocator **)yolov5._vptr_Net != &yolov5.opt.blob_allocator) {
      operator_delete(yolov5._vptr_Net);
    }
    cVar16 = cv::Mat::empty();
    if (cVar16 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov5);
      yolov5.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&yolov5,"yolov5s_6.0.param");
      ncnn::Net::load_model(&yolov5,"yolov5s_6.0.bin");
      iVar24 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      if (iVar24 < w) {
        fVar31 = 640.0 / (float)w;
        iVar17 = (int)((float)iVar24 * fVar31);
        iVar28 = 0x280;
      }
      else {
        fVar31 = 640.0 / (float)iVar24;
        iVar28 = (int)((float)w * fVar31);
        iVar17 = 0x280;
      }
      ncnn::Mat::from_pixels_resize(&in,local_80,0x10002,w,iVar24,iVar28,iVar17,(Allocator *)0x0);
      in_pad.cstep = 0;
      in_pad.data._0_4_ = 0;
      in_pad.data._4_4_ = 0;
      in_pad.refcount._0_4_ = 0;
      in_pad.refcount._4_4_ = 0;
      in_pad.elemsize = 0;
      in_pad.elempack = 0;
      in_pad.allocator = (Allocator *)0x0;
      in_pad.dims = 0;
      in_pad.w = 0;
      in_pad._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&out);
      iVar28 = ((iVar28 + 0x3f) / 0x40) * 0x40 - iVar28;
      iVar17 = ((iVar17 + 0x3f) / 0x40) * 0x40 - iVar17;
      left = iVar28 / 2;
      top = iVar17 / 2;
      ncnn::copy_make_border(&in,&in_pad,top,iVar17 - top,left,iVar28 - left,0,114.0,(Option *)&out)
      ;
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&in_pad,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"images",&in_pad);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize = 0;
      out.elempack = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"output",&out,0);
      anchors.cstep = 0;
      anchors.data._0_4_ = 0;
      anchors.data._4_4_ = 0;
      anchors.refcount._0_4_ = 0;
      anchors.refcount._4_4_ = 0;
      anchors.elemsize = 0;
      anchors.elempack = 0;
      anchors.allocator = (Allocator *)0x0;
      anchors.dims = 0;
      anchors.w = 0;
      anchors._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create(&anchors,6,4,(Allocator *)0x0);
      puVar12 = (undefined8 *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_);
      *puVar12 = 0x4150000041200000;
      puVar12[1] = 0x41f0000041800000;
      puVar12[2] = 0x41b8000042040000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&anchors,8,&in_pad,&out,0.0,&objects8);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar13 = (int *)CONCAT44(anchors.refcount._4_4_,anchors.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (anchors.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_));
            }
          }
          else {
            (*(anchors.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(out.refcount._4_4_,out.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (out.allocator == (Allocator *)0x0) {
            if (out.data != (void *)0x0) {
              free(out.data);
            }
          }
          else {
            (*(out.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize = 0;
      out.elempack = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"376",&out,0);
      anchors.cstep = 0;
      anchors.data._0_4_ = 0;
      anchors.data._4_4_ = 0;
      anchors.refcount._0_4_ = 0;
      anchors.refcount._4_4_ = 0;
      anchors.elemsize = 0;
      anchors.elempack = 0;
      anchors.allocator = (Allocator *)0x0;
      anchors.dims = 0;
      anchors.w = 0;
      anchors._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create(&anchors,6,4,(Allocator *)0x0);
      puVar12 = (undefined8 *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_);
      *puVar12 = 0x4274000041f00000;
      puVar12[1] = 0x4234000042780000;
      puVar12[2] = 0x42ee0000426c0000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&anchors,0x10,&in_pad,&out,0.0,&objects8);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar13 = (int *)CONCAT44(anchors.refcount._4_4_,anchors.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (anchors.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_));
            }
          }
          else {
            (*(anchors.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(out.refcount._4_4_,out.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (out.allocator == (Allocator *)0x0) {
            if (out.data != (void *)0x0) {
              free(out.data);
            }
          }
          else {
            (*(out.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize = 0;
      out.elempack = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"401",&out,0);
      anchors.cstep = 0;
      anchors.data._0_4_ = 0;
      anchors.data._4_4_ = 0;
      anchors.refcount._0_4_ = 0;
      anchors.refcount._4_4_ = 0;
      anchors.elemsize = 0;
      anchors.elempack = 0;
      anchors.allocator = (Allocator *)0x0;
      anchors.dims = 0;
      anchors.w = 0;
      anchors._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create(&anchors,6,4,(Allocator *)0x0);
      puVar12 = (undefined8 *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_);
      *puVar12 = 0x42b4000042e80000;
      puVar12[1] = 0x43460000431c0000;
      puVar12[2] = 0x43a3000043ba8000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&anchors,0x20,&in_pad,&out,0.0,&objects8);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar13 = (int *)CONCAT44(anchors.refcount._4_4_,anchors.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (anchors.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_));
            }
          }
          else {
            (*(anchors.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(out.refcount._4_4_,out.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (out.allocator == (Allocator *)0x0) {
            if (out.data != (void *)0x0) {
              free(out.data);
            }
          }
          else {
            (*(out.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)((ulong)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1);
      }
      anchors.data._0_4_ = 0;
      anchors.data._4_4_ = 0;
      anchors.elemsize = 0;
      anchors.refcount._4_4_ = 0;
      anchors.refcount._0_4_ = 0;
      uVar26 = (int)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x55555555;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&out,(long)(int)uVar26,
                 (allocator_type *)&objects8);
      if ((int)uVar26 < 1) {
        auVar36._12_4_ = 0;
        auVar36._0_12_ =
             (undefined1  [12])
             objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
             super__Vector_impl_data._4_12_;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._0_16_ = auVar36 << 0x20;
      }
      else {
        pfVar18 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar21 = 0;
        do {
          *(float *)((long)out.data + uVar21 * 4) = pfVar18[-1] * *pfVar18;
          uVar21 = uVar21 + 1;
          pfVar18 = pfVar18 + 6;
        } while ((uVar26 & 0x7fffffff) != uVar21);
        auVar40._12_4_ = 0;
        auVar40._0_12_ =
             (undefined1  [12])
             objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
             super__Vector_impl_data._4_12_;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._0_16_ = auVar40 << 0x20;
        iVar28 = 0;
        do {
          uVar20 = (uint)((ulong)((long)anchors.refcount -
                                 CONCAT44(anchors.data._4_4_,anchors.data._0_4_)) >> 2);
          if ((int)uVar20 < 1) {
LAB_0013c72c:
            if (anchors.refcount == (int *)anchors.elemsize) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&anchors,(iterator)anchors.refcount,
                         (int *)&objects8);
            }
            else {
              *anchors.refcount = iVar28;
              anchors.refcount = anchors.refcount + 1;
            }
          }
          else {
            lVar22 = (long)iVar28;
            uVar21._0_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar22].rect.x;
            uVar21._4_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar22].rect.y;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar21;
            uVar2 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22].rect.width;
            uVar7 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22].rect.height;
            auVar30._0_4_ = (float)uVar2 + (float)(undefined4)uVar21;
            auVar30._4_4_ = (float)uVar7 + (float)uVar21._4_4_;
            auVar30._8_8_ = 0;
            bVar14 = true;
            uVar21 = 0;
            do {
              lVar23 = (long)*(int *)(CONCAT44(anchors.data._4_4_,anchors.data._0_4_) + uVar21 * 4);
              uVar4._0_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar23].rect.x;
              uVar4._4_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar23].rect.y;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar4;
              uVar3 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar23].rect.width;
              uVar8 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar23].rect.height;
              auVar35._0_4_ = (float)uVar3 + (float)(undefined4)uVar4;
              auVar35._4_4_ = (float)uVar8 + (float)uVar4._4_4_;
              auVar35._8_8_ = 0;
              auVar40 = maxps(auVar39,auVar27);
              auVar36 = minps(auVar35,auVar30);
              fVar33 = auVar36._0_4_ - auVar40._0_4_;
              fVar38 = auVar36._4_4_ - auVar40._4_4_;
              fVar34 = 0.0;
              if (0.0 < fVar38 && 0.0 < fVar33) {
                fVar34 = fVar33 * fVar38;
              }
              if (0.45 < fVar34 / ((*(float *)((long)out.data + lVar23 * 4) +
                                   *(float *)((long)out.data + lVar22 * 4)) - fVar34)) {
                bVar14 = false;
              }
              uVar21 = uVar21 + 1;
            } while ((uVar20 & 0x7fffffff) != uVar21);
            if (bVar14) goto LAB_0013c72c;
          }
          iVar28 = (int)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_ + 1;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (float)iVar28;
        } while (iVar28 < (int)uVar26);
      }
      if (out.data != (void *)0x0) {
        operator_delete(out.data);
      }
      uVar26 = (uint)((ulong)((long)anchors.refcount -
                             CONCAT44(anchors.data._4_4_,anchors.data._0_4_)) >> 2);
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)(int)uVar26);
      if (0 < (int)uVar26) {
        uVar29 = CONCAT44((float)(iVar24 + -1),(float)(w + -1));
        lVar22 = 0;
        uVar21 = 0;
        do {
          iVar24 = *(int *)(CONCAT44(anchors.data._4_4_,anchors.data._0_4_) + uVar21 * 4);
          uVar5 = *(undefined8 *)
                   &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar24].rect.width;
          puVar12 = (undefined8 *)
                    ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).x + lVar22);
          *puVar12 = *(undefined8 *)
                      &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar24].rect;
          puVar12[1] = uVar5;
          *(undefined8 *)
           ((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start)->label + lVar22) =
               *(undefined8 *)
                &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar24].label;
          uVar5 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22);
          uVar6 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).width + lVar22);
          fVar33 = (float)uVar5;
          fVar34 = (float)((ulong)uVar5 >> 0x20);
          auVar32._0_4_ = fVar33 - (float)left;
          auVar32._4_4_ = fVar34 - (float)top;
          auVar32._8_8_ = 0;
          auVar10._4_4_ = fVar31;
          auVar10._0_4_ = fVar31;
          auVar10._8_4_ = fVar31;
          auVar10._12_4_ = fVar31;
          auVar36 = divps(auVar32,auVar10);
          auVar37._0_4_ = ((float)uVar6 + fVar33) - (float)left;
          auVar37._4_4_ = ((float)((ulong)uVar6 >> 0x20) + fVar34) - (float)top;
          auVar37._8_8_ = 0;
          auVar11._4_4_ = fVar31;
          auVar11._0_4_ = fVar31;
          auVar11._8_4_ = fVar31;
          auVar11._12_4_ = fVar31;
          auVar40 = divps(auVar37,auVar11);
          auVar41._8_4_ = 0xbf800000;
          auVar41._0_8_ = uVar29;
          auVar41._12_4_ = 0xbf800000;
          auVar36 = minps(auVar41,auVar36);
          auVar36 = maxps(ZEXT816(0),auVar36);
          auVar42._8_4_ = 0xbf800000;
          auVar42._0_8_ = uVar29;
          auVar42._12_4_ = 0xbf800000;
          auVar40 = minps(auVar42,auVar40);
          auVar40 = maxps(ZEXT816(0),auVar40);
          *(long *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22) = auVar36._0_8_;
          *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).width + lVar22) =
               CONCAT44(auVar40._4_4_ - auVar36._4_4_,auVar40._0_4_ - auVar36._0_4_);
          uVar21 = uVar21 + 1;
          lVar22 = lVar22 + 0x18;
        } while ((uVar26 & 0x7fffffff) != uVar21);
      }
      if ((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(anchors.data._4_4_,anchors.data._0_4_));
      }
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar13 = (int *)CONCAT44(in_pad.refcount._4_4_,in_pad.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (in_pad.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(in_pad.data._4_4_,in_pad.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(in_pad.data._4_4_,in_pad.data._0_4_));
            }
          }
          else {
            (*(in_pad.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(in.refcount._4_4_,in.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (in.allocator == (Allocator *)0x0) {
            if (in.data != (void *)0x0) {
              free(in.data);
            }
          }
          else {
            (*(in.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov5);
      cv::Mat::clone();
      pvVar15 = (void *)CONCAT44(in_pad.data._4_4_,in_pad.data._0_4_);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar22 = 0;
        uVar21 = 0;
        pOVar25 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          in_pad.data = pvVar15;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&pOVar25->prob + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).x + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).y + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).width + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).height + lVar22),
                  (ulong)*(uint *)((long)&pOVar25->label + lVar22));
          in_pad.elemsize = 0;
          in_pad.data._0_4_ = 0x3010000;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               (int)ROUND(*(float *)((long)&(pOVar25->rect).y + lVar22));
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)ROUND(*(float *)((long)&(pOVar25->rect).x + lVar22));
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)ROUND(*(float *)((long)&(pOVar25->rect).width + lVar22));
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               (int)ROUND(*(float *)((long)&(pOVar25->rect).height + lVar22));
          yolov5._vptr_Net = (_func_int **)0x406fe00000000000;
          yolov5.opt.lightmode = false;
          yolov5.opt._1_3_ = 0;
          yolov5.opt.num_threads = 0;
          yolov5.opt.blob_allocator = (Allocator *)0x0;
          yolov5.opt.workspace_allocator = (Allocator *)0x0;
          in_pad.refcount = (int *)&in;
          cv::rectangle(&in_pad,&proposals,&yolov5,1,8,0);
          sprintf((char *)&yolov5,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar25->prob + lVar22) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar25->label + lVar22) * 4));
          in_pad.data = &in_pad.elemsize;
          sVar19 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&in_pad,&yolov5,(long)&yolov5._vptr_Net + sVar19);
          cv::getTextSize((string *)&ex,(int)&in_pad,0.5,0,(int *)0x1);
          if ((size_t *)in_pad.data != &in_pad.elemsize) {
            operator_delete(in_pad.data);
          }
          fVar31 = (float)(int)*(float *)((long)&(pOVar25->rect).x + lVar22);
          iVar24 = (int)((*(float *)((long)&(pOVar25->rect).y + lVar22) -
                         (float)ex._vptr_Extractor._4_4_) - 0.0);
          if (iVar24 < 1) {
            iVar24 = 0;
          }
          fVar33 = (float)(in.refcount._4_4_ - (int)ex._vptr_Extractor);
          if ((int)ex._vptr_Extractor + (int)fVar31 <= in.refcount._4_4_) {
            fVar33 = fVar31;
          }
          anchors.elemsize = 0;
          anchors.data._0_4_ = 0x3010000;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = iVar24;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = fVar33;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (int)ex._vptr_Extractor;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = ex._vptr_Extractor._4_4_;
          in_pad.data._0_4_ = 0;
          in_pad.data._4_4_ = 0x406fe000;
          in_pad.refcount._0_4_ = 0;
          in_pad.refcount._4_4_ = 0x406fe000;
          in_pad.elemsize = 0x406fe00000000000;
          in_pad.elempack = 0;
          in_pad._28_4_ = 0;
          anchors.refcount = (int *)&in;
          cv::rectangle(&anchors,&objects8,&in_pad,0xffffffff,8,0);
          anchors.elemsize = 0;
          anchors.data._0_4_ = 0x3010000;
          in_pad.data = &in_pad.elemsize;
          anchors.refcount = (int *)&in;
          sVar19 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&in_pad,&yolov5,(long)&yolov5._vptr_Net + sVar19);
          norm_vals[1] = (float)(iVar24 + ex._vptr_Extractor._4_4_);
          norm_vals[0] = fVar33;
          out.data = (void *)0x0;
          out.refcount._0_4_ = 0;
          out.refcount._4_4_ = 0;
          out.elemsize = 0;
          out.elempack = 0;
          out._28_4_ = 0;
          cv::putText(0x3fe0000000000000,&anchors,&in_pad,norm_vals,0,&out,1,8,0);
          pvVar15 = in_pad.data;
          if ((size_t *)in_pad.data != &in_pad.elemsize) {
            operator_delete(in_pad.data);
            pvVar15 = in_pad.data;
          }
          in_pad.data._4_4_ = (undefined4)((ulong)pvVar15 >> 0x20);
          uVar21 = uVar21 + 1;
          lVar22 = lVar22 + 0x18;
          pOVar25 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      in_pad.refcount = (int *)&in;
      ppAVar1 = &yolov5.opt.blob_allocator;
      yolov5.opt.blob_allocator =
           (Allocator *)CONCAT26(yolov5.opt.blob_allocator._6_2_,0x6567616d69);
      yolov5.opt.lightmode = true;
      yolov5.opt._1_3_ = 0;
      yolov5.opt.num_threads = 0;
      in_pad.elemsize = 0;
      in_pad.data._0_4_ = 0x1010000;
      yolov5._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&yolov5,(_InputArray *)&in_pad);
      if ((Allocator **)yolov5._vptr_Net != ppAVar1) {
        operator_delete(yolov5._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&in);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar24 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar9);
      iVar24 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar24 = -1;
  }
  return iVar24;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov5(m, objects);

    draw_objects(m, objects);

    return 0;
}